

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

void mpz_submul_ui(__mpz_struct *r,__mpz_struct *u,unsigned_long v)

{
  mpz_t t;
  __mpz_struct local_38;
  
  local_38._mp_d = &mpz_init::dummy_limb;
  local_38._mp_alloc = 0;
  if (v == 0) {
    local_38._mp_alloc = 0;
    local_38._mp_size = 0;
  }
  else {
    local_38._mp_size = 1;
    local_38._mp_d = (mp_limb_t *)(*gmp_allocate_func)(8);
    local_38._mp_alloc = 1;
    *local_38._mp_d = v;
  }
  mpz_mul(&local_38,u,&local_38);
  mpz_sub(r,r,&local_38);
  if ((long)local_38._mp_alloc != 0) {
    (*gmp_free_func)(local_38._mp_d,(long)local_38._mp_alloc << 3);
    return;
  }
  return;
}

Assistant:

void
mpz_submul_ui (mpz_t r, const mpz_t u, unsigned long int v)
{
  mpz_t t;
  mpz_init_set_ui (t, v);
  mpz_mul (t, u, t);
  mpz_sub (r, r, t);
  mpz_clear (t);
}